

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  int iVar1;
  Proto *pPVar2;
  global_State *g;
  byte bVar3;
  int iVar4;
  TString **ppTVar5;
  ulong uVar6;
  ulong uVar7;
  BlockCnt *pBVar8;
  long lVar9;
  
  if (fs == (FuncState *)0x0) {
    var->t = -1;
    var->f = -1;
    var->k = VGLOBAL;
    (var->u).s.info = 0xff;
    iVar4 = 8;
  }
  else {
    uVar6 = (ulong)fs->nactvar;
    do {
      uVar7 = uVar6;
      if ((long)uVar7 < 1) {
        iVar4 = singlevaraux(fs->prev,n,var,0);
        if (iVar4 == 8) {
          return 8;
        }
        pPVar2 = fs->f;
        iVar4 = pPVar2->sizeupvalues;
        lVar9 = (long)iVar4;
        bVar3 = pPVar2->nups;
        if (bVar3 == 0) goto LAB_0010fb90;
        uVar6 = 0;
        goto LAB_0010fb68;
      }
      uVar6 = uVar7 - 1;
    } while (fs->f->locvars[*(ushort *)&fs->upvalues[uVar7 + 0x3b].info].varname != n);
    var->t = -1;
    var->f = -1;
    var->k = VLOCAL;
    (var->u).s.info = (int)(uVar7 - 1);
    iVar4 = 6;
    if (base == 0) {
      pBVar8 = (BlockCnt *)&fs->bl;
      do {
        pBVar8 = pBVar8->previous;
        if (pBVar8 == (BlockCnt *)0x0) {
          return 6;
        }
      } while ((long)uVar7 <= (long)(ulong)pBVar8->nactvar);
      pBVar8->upval = '\x01';
    }
  }
  return iVar4;
  while (uVar6 = uVar6 + 1, bVar3 != uVar6) {
LAB_0010fb68:
    if ((var->k == (uint)fs->upvalues[uVar6].k) &&
       ((var->u).s.info == (uint)fs->upvalues[uVar6].info)) goto LAB_0010fc4d;
  }
  if (0x3b < bVar3) {
    errorlimit(fs,0x3c,"upvalues");
  }
LAB_0010fb90:
  if (iVar4 <= (int)(uint)bVar3) {
    ppTVar5 = (TString **)
              luaM_growaux_(fs->L,pPVar2->upvalues,&pPVar2->sizeupvalues,8,0x7ffffffd,"");
    pPVar2->upvalues = ppTVar5;
    iVar1 = pPVar2->sizeupvalues;
    if (iVar4 < iVar1) {
      do {
        pPVar2->upvalues[lVar9] = (TString *)0x0;
        lVar9 = lVar9 + 1;
      } while (iVar1 != lVar9);
    }
  }
  bVar3 = pPVar2->nups;
  uVar6 = (ulong)bVar3;
  pPVar2->upvalues[uVar6] = n;
  if ((((n->tsv).marked & 3) != 0) && ((pPVar2->marked & 4) != 0)) {
    g = fs->L->l_G;
    if (g->gcstate == '\x01') {
      reallymarkobject(g,(GCObject *)n);
      bVar3 = pPVar2->nups;
      uVar6 = (ulong)bVar3;
    }
    else {
      pPVar2->marked = g->currentwhite & 3 | pPVar2->marked & 0xf8;
    }
  }
  fs->upvalues[uVar6].k = (char)var->k;
  fs->upvalues[uVar6].info = *(lu_byte *)&var->u;
  pPVar2->nups = bVar3 + 1;
  uVar6 = (ulong)bVar3;
LAB_0010fc4d:
  (var->u).s.info = (int)uVar6;
  var->k = VUPVAL;
  return 7;
}

Assistant:

static int singlevaraux(FuncState*fs,TString*n,expdesc*var,int base){
if(fs==NULL){
init_exp(var,VGLOBAL,((1<<8)-1));
return VGLOBAL;
}
else{
int v=searchvar(fs,n);
if(v>=0){
init_exp(var,VLOCAL,v);
if(!base)
markupval(fs,v);
return VLOCAL;
}
else{
if(singlevaraux(fs->prev,n,var,0)==VGLOBAL)
return VGLOBAL;
var->u.s.info=indexupvalue(fs,n,var);
var->k=VUPVAL;
return VUPVAL;
}
}
}